

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

FunctionPrototypeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::FunctionPrototypeSyntax,slang::syntax::FunctionPrototypeSyntax_const&>
          (BumpAllocator *this,FunctionPrototypeSyntax *args)

{
  FunctionPrototypeSyntax *pFVar1;
  FunctionPrototypeSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pFVar1 = (FunctionPrototypeSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::FunctionPrototypeSyntax::FunctionPrototypeSyntax(in_RSI,pFVar1);
  return pFVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }